

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O2

void FileWatcherAddWatch(HFileWatcher handle,char *watch)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  allocator<char> local_41;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_40 = watch;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)handle + 0x38))->__data);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                    (*(undefined8 *)((long)handle + 0x10),*(undefined8 *)((long)handle + 0x18),
                     &local_40);
  if (_Var1._M_current ==
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)((long)handle + 0x18))
  {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,local_40,&local_41);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               ((long)handle + 0x10),&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)handle + 0x38));
  return;
}

Assistant:

void FileWatcherAddWatch(HFileWatcher handle, const char* watch) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    auto it = std::find(watcher->Watches.begin(), watcher->Watches.end(), watch);
    if (it == watcher->Watches.end()) {
        watcher->Watches.push_back(std::string(watch));
    }
}